

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_erl_generator.cc
# Opt level: O2

string * __thiscall
t_erl_generator::atomify(string *__return_storage_ptr__,t_erl_generator *this,string *in)

{
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  string local_38;
  
  this_00 = &bStack_78;
  if (this->legacy_names_ == true) {
    std::__cxx11::string::string((string *)&local_38,(string *)in);
    t_generator::decapitalize(&local_58,&this->super_t_generator,&local_38);
    std::operator+(&bStack_78,"\'",&local_58);
    std::operator+(__return_storage_ptr__,&bStack_78,"\'");
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = &local_38;
  }
  else {
    std::operator+(&bStack_78,"\'",in);
    std::operator+(__return_storage_ptr__,&bStack_78,"\'");
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string atomify(std::string in) {
    if (legacy_names_) {
      return "'" + decapitalize(in) + "'";
    } else {
      return "'" + in + "'";
    }
  }